

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_worker_postMessage(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue obj;
  undefined1 auVar1 [16];
  int iVar2;
  uint8_t *__src;
  void *__ptr;
  void *pvVar3;
  ssize_t sVar4;
  int *piVar5;
  int ret;
  uint8_t ch;
  uint8_t **sab_tab;
  JSWorkerMessage *msg;
  uint8_t *data;
  size_t i;
  size_t sab_tab_len;
  size_t data_len;
  JSWorkerMessagePipe *ps;
  JSWorkerData *worker;
  list_head *head;
  int in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  undefined4 local_78;
  JSClassID in_stack_ffffffffffffff8c;
  JSContext *in_stack_ffffffffffffff90;
  JSValueUnion in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  ulong uVar6;
  list_head local_58;
  long local_48;
  void *local_40;
  undefined4 uStack_c;
  undefined8 local_8;
  
  obj.tag = in_stack_ffffffffffffffa0;
  obj.u.float64 = in_stack_ffffffffffffff98.float64;
  local_40 = JS_GetOpaque2(in_stack_ffffffffffffff90,obj,in_stack_ffffffffffffff8c);
  if (local_40 == (void *)0x0) {
    local_8 = 6;
  }
  else {
    head = &local_58;
    __src = JS_WriteObject2((JSContext *)i,(size_t *)data,_sab_tab_len,msg._4_4_,
                            (uint8_t ***)sab_tab,(size_t *)argv);
    if (__src == (uint8_t *)0x0) {
      local_8 = 6;
    }
    else {
      __ptr = malloc(0x30);
      if (__ptr != (void *)0x0) {
        *(undefined8 *)((long)__ptr + 0x10) = 0;
        *(undefined8 *)((long)__ptr + 0x20) = 0;
        pvVar3 = malloc((size_t)local_58.next);
        *(void **)((long)__ptr + 0x10) = pvVar3;
        if (*(long *)((long)__ptr + 0x10) != 0) {
          memcpy(*(void **)((long)__ptr + 0x10),__src,(size_t)local_58.next);
          *(list_head **)((long)__ptr + 0x18) = local_58.next;
          pvVar3 = malloc((long)local_58.prev << 3);
          *(void **)((long)__ptr + 0x20) = pvVar3;
          if (*(long *)((long)__ptr + 0x20) != 0) {
            memcpy(*(void **)((long)__ptr + 0x20),
                   (void *)CONCAT44(in_stack_ffffffffffffff8c,local_78),(long)local_58.prev << 3);
            *(list_head **)((long)__ptr + 0x28) = local_58.prev;
            js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),head)
            ;
            js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),head)
            ;
            for (uVar6 = 0; uVar6 < *(ulong *)((long)__ptr + 0x28); uVar6 = uVar6 + 1) {
              js_sab_dup((void *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),head)
              ;
            }
            local_48 = *(long *)((long)local_40 + 8);
            pthread_mutex_lock((pthread_mutex_t *)(local_48 + 8));
            iVar2 = list_empty((list_head *)(local_48 + 0x30));
            if (iVar2 != 0) {
              in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 & 0xffffff;
              while( true ) {
                sVar4 = write(*(int *)(local_48 + 0x44),&stack0xffffffffffffff87,1);
                in_stack_ffffffffffffff80 = (int)sVar4;
                if (in_stack_ffffffffffffff80 == 1) break;
                if ((in_stack_ffffffffffffff80 < 0) &&
                   ((piVar5 = __errno_location(), *piVar5 != 0xb ||
                    (piVar5 = __errno_location(), *piVar5 != 4)))) break;
              }
            }
            list_add_tail((list_head *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                          ,head);
            pthread_mutex_unlock((pthread_mutex_t *)(local_48 + 8));
            local_8 = 3;
            goto LAB_00113c3e;
          }
        }
      }
      if (__ptr != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x10));
        free(*(void **)((long)__ptr + 0x20));
        free(__ptr);
      }
      js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),head);
      js_free((JSContext *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),head);
      local_8 = 6;
    }
  }
LAB_00113c3e:
  auVar1._4_8_ = local_8;
  auVar1._0_4_ = uStack_c;
  auVar1._12_4_ = 0;
  return (JSValue)(auVar1 << 0x20);
}

Assistant:

static JSValue js_worker_postMessage(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSWorkerData *worker = JS_GetOpaque2(ctx, this_val, js_worker_class_id);
    JSWorkerMessagePipe *ps;
    size_t data_len, sab_tab_len, i;
    uint8_t *data;
    JSWorkerMessage *msg;
    uint8_t **sab_tab;
    
    if (!worker)
        return JS_EXCEPTION;
    
    data = JS_WriteObject2(ctx, &data_len, argv[0],
                           JS_WRITE_OBJ_SAB | JS_WRITE_OBJ_REFERENCE,
                           &sab_tab, &sab_tab_len);
    if (!data)
        return JS_EXCEPTION;

    msg = malloc(sizeof(*msg));
    if (!msg)
        goto fail;
    msg->data = NULL;
    msg->sab_tab = NULL;

    /* must reallocate because the allocator may be different */
    msg->data = malloc(data_len);
    if (!msg->data)
        goto fail;
    memcpy(msg->data, data, data_len);
    msg->data_len = data_len;

    msg->sab_tab = malloc(sizeof(msg->sab_tab[0]) * sab_tab_len);
    if (!msg->sab_tab)
        goto fail;
    memcpy(msg->sab_tab, sab_tab, sizeof(msg->sab_tab[0]) * sab_tab_len);
    msg->sab_tab_len = sab_tab_len;

    js_free(ctx, data);
    js_free(ctx, sab_tab);
    
    /* increment the SAB reference counts */
    for(i = 0; i < msg->sab_tab_len; i++) {
        js_sab_dup(NULL, msg->sab_tab[i]);
    }

    ps = worker->send_pipe;
    pthread_mutex_lock(&ps->mutex);
    /* indicate that data is present */
    if (list_empty(&ps->msg_queue)) {
        uint8_t ch = '\0';
        int ret;
        for(;;) {
            ret = write(ps->write_fd, &ch, 1);
            if (ret == 1)
                break;
            if (ret < 0 && (errno != EAGAIN || errno != EINTR))
                break;
        }
    }
    list_add_tail(&msg->link, &ps->msg_queue);
    pthread_mutex_unlock(&ps->mutex);
    return JS_UNDEFINED;
 fail:
    if (msg) {
        free(msg->data);
        free(msg->sab_tab);
        free(msg);
    }
    js_free(ctx, data);
    js_free(ctx, sab_tab);
    return JS_EXCEPTION;
    
}